

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

bool __thiscall Js::RecyclableObject::HasOnlyWritableDataProperties(RecyclableObject *this)

{
  bool bVar1;
  TypeId typeId;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  ArrayObject *this_02;
  CustomExternalWrapperObject *this_03;
  bool local_2a;
  bool local_29;
  DynamicObject *obj;
  RecyclableObject *this_local;
  
  typeId = GetTypeId(this);
  bVar1 = DynamicType::Is(typeId);
  if (!bVar1) {
    return true;
  }
  this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
  this_01 = DynamicObject::GetTypeHandler(this_00);
  bVar1 = DynamicTypeHandler::GetHasOnlyWritableDataProperties(this_01);
  local_29 = false;
  if (bVar1) {
    bVar1 = DynamicObject::HasObjectArray(this_00);
    if (bVar1) {
      this_02 = DynamicObject::GetObjectArrayOrFlagsAsArray(this_00);
      bVar1 = HasOnlyWritableDataProperties((RecyclableObject *)this_02);
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = VarIs<Js::CustomExternalWrapperObject,Js::DynamicObject>(this_00);
    local_2a = true;
    if (bVar1) {
      this_03 = UnsafeVarTo<Js::CustomExternalWrapperObject,Js::DynamicObject>(this_00);
      local_2a = Js::CustomExternalWrapperObject::IsInitialized(this_03);
    }
    local_29 = local_2a;
  }
  return local_29;
}

Assistant:

bool RecyclableObject::HasOnlyWritableDataProperties()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            return obj->GetTypeHandler()->GetHasOnlyWritableDataProperties() &&
                (!obj->HasObjectArray() || obj->GetObjectArrayOrFlagsAsArray()->HasOnlyWritableDataProperties())
#ifdef _CHAKRACOREBUILD
                && (!VarIs<CustomExternalWrapperObject>(obj) || UnsafeVarTo<CustomExternalWrapperObject>(obj)->IsInitialized())
#endif
                ;
        }

        return true;
    }